

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

void record_shader_modules(StateRecorder *recorder)

{
  uint32_t *puVar1;
  bool bVar2;
  VkShaderModule_T *pVVar3;
  undefined1 local_38 [8];
  VkShaderModuleCreateInfo info;
  StateRecorder *recorder_local;
  
  info.pCode = (uint32_t *)recorder;
  memset(local_38,0,0x28);
  puVar1 = info.pCode;
  local_38._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
  info.codeSize = (size_t)record_shader_modules::code;
  info.flags = 8;
  info._20_4_ = 0;
  pVVar3 = fake_handle<VkShaderModule_T*>(5000);
  bVar2 = Fossilize::StateRecorder::record_shader_module
                    ((StateRecorder *)puVar1,pVVar3,(VkShaderModuleCreateInfo *)local_38,0);
  puVar1 = info.pCode;
  if (!bVar2) {
    abort();
  }
  info.codeSize = (size_t)record_shader_modules::code2;
  info.flags = 0x10;
  info._20_4_ = 0;
  pVVar3 = fake_handle<VkShaderModule_T*>(0x1389);
  bVar2 = Fossilize::StateRecorder::record_shader_module
                    ((StateRecorder *)puVar1,pVVar3,(VkShaderModuleCreateInfo *)local_38,0);
  if (!bVar2) {
    abort();
  }
  return;
}

Assistant:

static void record_shader_modules(StateRecorder &recorder)
{
	VkShaderModuleCreateInfo info = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
	static const uint32_t code[] = { 0xdeadbeef, 0xcafebabe };
	info.pCode = code;
	info.codeSize = sizeof(code);

	if (!recorder.record_shader_module(fake_handle<VkShaderModule>(5000), info))
		abort();

	static const uint32_t code2[] = { 0xabba1337, 0xbabba100, 0xdeadbeef, 0xcafebabe };
	info.pCode = code2;
	info.codeSize = sizeof(code2);
	if (!recorder.record_shader_module(fake_handle<VkShaderModule>(5001), info))
		abort();
}